

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minicrypto.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  ptls_iovec_t key;
  ptls_iovec_t cert;
  ptls_minicrypto_lookup_certificate_t lookup_certificate;
  ptls_iovec_t local_80;
  ptls_minicrypto_lookup_certificate_t local_70;
  ptls_context_t local_58;
  
  subtest("secp256r1",test_secp256r1_key_exchange);
  subtest("x25519",test_x25519_key_exchange);
  subtest("secp256r1-sign",test_secp256r1_sign);
  local_80.base = (uint8_t *)anon_var_dwarf_14dfc;
  local_80.len = 0x19b;
  local_70.super.cb = ::lookup_certificate;
  local_70.identities = (st_ptls_minicrypto_identity_t **)0x0;
  local_70.count = 0;
  key.len = 0x20;
  key.base = (uint8_t *)anon_var_dwarf_14de6;
  ptls_minicrypto_lookup_certificate_add_identity(&local_70,"example.com",0x403,key,&local_80,1);
  ctx_peer = &local_58;
  local_58.random_bytes = ptls_minicrypto_random_bytes;
  local_58.key_exchanges = ptls_minicrypto_key_exchanges;
  local_58.cipher_suites = ptls_minicrypto_cipher_suites;
  local_58.verify_certificate = (ptls_verify_certificate_t *)0x0;
  local_58.ticket_lifetime = 0;
  local_58.max_early_data_size = 0;
  local_58.require_dhe_on_psk = 0;
  local_58.encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
  local_58.decrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
  local_58.save_ticket = (ptls_save_ticket_t *)0x0;
  ctx = ctx_peer;
  local_58.lookup_certificate = &local_70.super;
  subtest("picotls",test_picotls);
  iVar1 = done_testing();
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    subtest("secp256r1", test_secp256r1_key_exchange);
    subtest("x25519", test_x25519_key_exchange);
    subtest("secp256r1-sign", test_secp256r1_sign);

    ptls_minicrypto_lookup_certificate_t lookup_certificate;
    ptls_iovec_t key = ptls_iovec_init(SECP256R1_PRIVATE_KEY, sizeof(SECP256R1_PRIVATE_KEY) - 1),
                 cert = ptls_iovec_init(SECP256R1_CERTIFICATE, sizeof(SECP256R1_CERTIFICATE) - 1);
    ptls_minicrypto_init_lookup_certificate(&lookup_certificate);
    ptls_minicrypto_lookup_certificate_add_identity(&lookup_certificate, "example.com", PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256, key,
                                                    &cert, 1);

    ptls_context_t ctxbuf = {ptls_minicrypto_random_bytes, ptls_minicrypto_key_exchanges, ptls_minicrypto_cipher_suites,
                             &lookup_certificate.super};
    ctx = ctx_peer = &ctxbuf;

    subtest("picotls", test_picotls);

    return done_testing();
    return done_testing();
}